

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_build_obmc_inter_prediction
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **above,int *above_stride,uint8_t **left,
               int *left_stride)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  MB_MODE_INFO **ppMVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  MB_MODE_INFO *pMVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint8_t *puVar14;
  _func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
  **pp_Var15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int plane;
  uint uVar22;
  uint uVar20;
  long lVar21;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  uint length;
  int plane_1;
  int *piVar26;
  int iVar27;
  uint local_c0;
  
  ppMVar6 = xd->mi;
  uVar11 = (ulong)(*ppMVar6)->bsize;
  if (xd->up_available == true) {
    uVar2 = xd->mi_col;
    lVar12 = (long)(int)uVar2;
    iVar18 = xd->width + uVar2;
    iVar3 = (cm->mi_params).mi_cols;
    if (iVar3 <= iVar18) {
      iVar18 = iVar3;
    }
    if (((0x3efffcUL >> (uVar11 & 0x3f) & 1) != 0) && ((int)uVar2 < iVar18)) {
      iVar3 = max_neighbor_obmc[""[uVar11]];
      lVar13 = (long)xd->mi_stride;
      uVar1 = cm->seq_params->monochrome;
      iVar25 = 0;
      uVar20 = uVar2;
      do {
        bVar16 = 0x10;
        if ((0x1f07ffUL >> ((ulong)ppMVar6[((int)uVar20 - lVar13) - lVar12]->bsize & 0x3f) & 1) != 0
           ) {
          bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [ppMVar6[((int)uVar20 - lVar13) - lVar12]->bsize];
        }
        lVar21 = ((int)uVar20 - lVar13) - lVar12;
        uVar22 = uVar20 & 0xfffffffe;
        if (bVar16 == 1) {
          bVar16 = 2;
          uVar20 = uVar22;
          lVar21 = (((long)(int)uVar22 + 1) - lVar13) - lVar12;
        }
        if (((ppMVar6[lVar21]->field_0xa7 & 0x80) != 0) || ('\0' < ppMVar6[lVar21]->ref_frame[0])) {
          uVar22._0_1_ = xd->width;
          uVar22._1_1_ = xd->height;
          uVar22._2_2_ = *(undefined2 *)&xd->field_0x2076;
          if (bVar16 <= (byte)(undefined1)uVar22) {
            uVar22 = (uint)bVar16;
          }
          uVar23 = (ulong)(*xd->mi)->bsize;
          uVar24 = 0x20;
          if ((0x2f0bffUL >> (uVar23 & 0x3f) & 1) != 0) {
            uVar24 = (uint)(block_size_high[uVar23] >> 1);
          }
          iVar25 = iVar25 + 1;
          lVar21 = 0;
          piVar26 = &xd->plane[0].subsampling_x;
          do {
            bVar17 = (byte)*piVar26;
            length = uVar24 >> ((byte)piVar26[1] & 0x1f);
            if (BLOCK_8X4 < av1_ss_size_lookup[uVar23][*piVar26][piVar26[1]]) {
              iVar19 = (int)((uVar20 - uVar2) * 4) >> (bVar17 & 0x1f);
              uVar4 = piVar26[9];
              puVar7 = ((buf_2d *)(piVar26 + 3))->buf;
              uVar5 = above_stride[lVar21];
              puVar8 = above[lVar21];
              iVar27 = 0x39ff03;
              puVar14 = av1_get_obmc_mask(length);
              if ((xd->cur_buf->flags & 8) == 0) {
                pp_Var15 = &aom_blend_a64_vmask;
              }
              else {
                iVar27 = xd->bd;
                pp_Var15 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                            **)&aom_highbd_blend_a64_vmask;
              }
              (**pp_Var15)(puVar7 + iVar19,uVar4,puVar7 + iVar19,uVar4,puVar8 + iVar19,uVar5,puVar14
                           ,((uVar22 & 0xff) << 2) >> (bVar17 & 0x1f),length,iVar27);
            }
            lVar21 = lVar21 + 1;
            piVar26 = piVar26 + 0x28c;
          } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar21);
        }
        uVar20 = uVar20 + bVar16;
      } while (((int)uVar20 < iVar18) && (iVar25 < iVar3));
    }
  }
  if (xd->left_available == true) {
    uVar2 = xd->mi_row;
    iVar18 = xd->height + uVar2;
    iVar3 = (cm->mi_params).mi_rows;
    if (iVar3 <= iVar18) {
      iVar18 = iVar3;
    }
    if (((0x3dfffaUL >> (uVar11 & 0x3f) & 1) != 0) && ((int)uVar2 < iVar18)) {
      iVar3 = max_neighbor_obmc[""[uVar11]];
      ppMVar6 = xd->mi;
      lVar12 = (long)xd->mi_stride * (long)(int)uVar2;
      uVar1 = cm->seq_params->monochrome;
      iVar25 = 0;
      uVar20 = uVar2;
      do {
        lVar13 = (long)(int)(xd->mi_stride * uVar20);
        uVar11 = (ulong)ppMVar6[(lVar13 + -1) - lVar12]->bsize;
        bVar16 = 0x10;
        if ((0x2f0bffUL >> (uVar11 & 0x3f) & 1) != 0) {
          bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar11];
        }
        if (bVar16 == 1) {
          bVar16 = 2;
          lVar13 = (long)(int)(xd->mi_stride * (uVar20 | 1));
          uVar20 = uVar20 & 0xfffffffe;
        }
        pMVar9 = ppMVar6[(lVar13 + -1) - lVar12];
        if (((pMVar9->field_0xa7 & 0x80) != 0) || ('\0' < pMVar9->ref_frame[0])) {
          bVar17 = xd->height;
          if (bVar16 <= xd->height) {
            bVar17 = bVar16;
          }
          uVar11 = (ulong)(*xd->mi)->bsize;
          local_c0 = 0x20;
          if ((0x1f07ffUL >> (uVar11 & 0x3f) & 1) != 0) {
            local_c0 = (uint)(block_size_wide[uVar11] >> 1);
          }
          iVar25 = iVar25 + 1;
          lVar13 = 0;
          piVar26 = &xd->plane[0].subsampling_x;
          do {
            uVar22 = local_c0 >> ((byte)*piVar26 & 0x1f);
            iVar19 = piVar26[1];
            iVar10 = (int)((uVar20 - uVar2) * 4) >> ((byte)iVar19 & 0x1f);
            uVar4 = piVar26[9];
            puVar7 = ((buf_2d *)(piVar26 + 3))->buf;
            uVar5 = left_stride[lVar13];
            puVar8 = left[lVar13];
            iVar27 = 0x3a01dd;
            puVar14 = av1_get_obmc_mask(uVar22);
            if ((xd->cur_buf->flags & 8) == 0) {
              pp_Var15 = &aom_blend_a64_hmask;
            }
            else {
              iVar27 = xd->bd;
              pp_Var15 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                          **)&aom_highbd_blend_a64_hmask;
            }
            (**pp_Var15)(puVar7 + (int)(iVar10 * uVar4),uVar4,puVar7 + (int)(iVar10 * uVar4),uVar4,
                         puVar8 + (int)(iVar10 * uVar5),uVar5,puVar14,uVar22,
                         ((uint)bVar17 << 2) >> ((byte)iVar19 & 0x1f),iVar27);
            lVar13 = lVar13 + 1;
            piVar26 = piVar26 + 0x28c;
          } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar13);
        }
        uVar20 = uVar20 + bVar16;
      } while (((int)uVar20 < iVar18) && (iVar25 < iVar3));
    }
  }
  return;
}

Assistant:

void av1_build_obmc_inter_prediction(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                     uint8_t *above[MAX_MB_PLANE],
                                     int above_stride[MAX_MB_PLANE],
                                     uint8_t *left[MAX_MB_PLANE],
                                     int left_stride[MAX_MB_PLANE]) {
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  // handle above row
  struct obmc_inter_pred_ctxt ctxt_above = { above, above_stride };
  foreach_overlappable_nb_above(cm, xd,
                                max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                build_obmc_inter_pred_above, &ctxt_above);

  // handle left column
  struct obmc_inter_pred_ctxt ctxt_left = { left, left_stride };
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_inter_pred_left, &ctxt_left);
}